

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_enemy.cpp
# Opt level: O3

int AF_AActor_A_ClearLastHeard
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  undefined8 *puVar1;
  PClass *pPVar2;
  PClass *pPVar3;
  char *__assertion;
  bool bVar4;
  
  pPVar2 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
  }
  else if (((param->field_0).field_3.Type == '\x03') && ((param->field_0).field_1.atag == 1)) {
    puVar1 = (undefined8 *)(param->field_0).field_1.a;
    pPVar3 = (PClass *)puVar1[1];
    if (pPVar3 == (PClass *)0x0) {
      pPVar3 = (PClass *)(**(code **)*puVar1)(puVar1);
      puVar1[1] = pPVar3;
    }
    bVar4 = pPVar3 != (PClass *)0x0;
    if (pPVar3 != pPVar2 && bVar4) {
      do {
        pPVar3 = pPVar3->ParentClass;
        bVar4 = pPVar3 != (PClass *)0x0;
        if (pPVar3 == pPVar2) break;
      } while (pPVar3 != (PClass *)0x0);
    }
    if (bVar4) {
      puVar1[0x43] = 0;
      return 0;
    }
    __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
  }
  else {
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_enemy.cpp"
                ,0x8d6,
                "int AF_AActor_A_ClearLastHeard(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
               );
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_ClearLastHeard)
{
	PARAM_SELF_PROLOGUE(AActor);
	self->LastHeard = NULL;
	return 0;
}